

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TermAppender.h
# Opt level: O1

void aeron::concurrent::logbuffer::TermAppender::checkTerm(int32_t expectedTermId,int32_t termId)

{
  SourcedException *this;
  long *plVar1;
  char *pcVar2;
  size_type *psVar3;
  allocator local_109;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if (termId == expectedTermId) {
    return;
  }
  this = (SourcedException *)__cxa_allocate_exception(0x48);
  std::__cxx11::to_string(&local_88,expectedTermId);
  std::operator+(&local_68,"action possibly delayed: expectedTermId=",&local_88);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_68);
  local_108._M_dataplus._M_p = (pointer)*plVar1;
  psVar3 = (size_type *)(plVar1 + 2);
  if ((size_type *)local_108._M_dataplus._M_p == psVar3) {
    local_108.field_2._M_allocated_capacity = *psVar3;
    local_108.field_2._8_8_ = plVar1[3];
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  }
  else {
    local_108.field_2._M_allocated_capacity = *psVar3;
  }
  local_108._M_string_length = plVar1[1];
  *plVar1 = (long)psVar3;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  std::__cxx11::to_string(&local_a8,termId);
  std::operator+(&local_48,&local_108,&local_a8);
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e8,
             "static void aeron::concurrent::logbuffer::TermAppender::checkTerm(std::int32_t, std::int32_t)"
             ,"");
  pcVar2 = util::past_prefix("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                             ,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/build_O1/deps/aeron/src/aeron_project/aeron-client/src/main/cpp/concurrent/logbuffer/TermAppender.h"
                            );
  std::__cxx11::string::string((string *)&local_c8,pcVar2,&local_109);
  util::SourcedException::SourcedException(this,&local_48,&local_e8,&local_c8,0x165);
  *(undefined ***)this = &PTR__SourcedException_00163aa0;
  __cxa_throw(this,&util::IllegalStateException::typeinfo,util::SourcedException::~SourcedException)
  ;
}

Assistant:

inline static void checkTerm(std::int32_t expectedTermId, std::int32_t termId)
    {
        if (termId != expectedTermId)
        {
            throw util::IllegalStateException(
                "action possibly delayed: expectedTermId=" + std::to_string(expectedTermId) +
                " termId=" + std::to_string(termId), SOURCEINFO);
        }
    }